

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.h
# Opt level: O0

void __thiscall Js::ByteBlock::ByteBlock(ByteBlock *this,uint size,Recycler *alloc)

{
  Recycler *pRVar1;
  uchar *ptr;
  TrackAllocData local_50;
  nullptr_t local_28;
  Recycler *local_20;
  Recycler *alloc_local;
  ByteBlock *pBStack_10;
  uint size_local;
  ByteBlock *this_local;
  
  this->m_contentSize = size;
  local_28 = (nullptr_t)0x0;
  local_20 = alloc;
  alloc_local._4_4_ = size;
  pBStack_10 = this;
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierPtr(&this->m_content,&local_28);
  pRVar1 = local_20;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&unsigned_char::typeinfo,0,(ulong)alloc_local._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteBlock.h"
             ,0x1d);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                  ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeaf,0,
                   (ulong)alloc_local._4_4_);
  Memory::WriteBarrierPtr<unsigned_char>::operator=(&this->m_content,ptr);
  return;
}

Assistant:

ByteBlock(uint size, Recycler *alloc) : m_contentSize(size), m_content(nullptr)
        {
            // The New function below will copy over a buffer into this so
            // we don't need to zero it out
            m_content = RecyclerNewArrayLeaf(alloc, byte, size);
        }